

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O1

void wr_gear_aux(object *gear)

{
  wchar_t wVar1;
  
  if (gear != (object *)0x0) {
    do {
      if (gear->kind == (object_kind *)0x0) {
        __assert_fail("obj->kind",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/save.c"
                      ,0x31e,"void wr_gear_aux(struct object *)");
      }
      wVar1 = object_slot(player->body,gear);
      wr_byte((uint8_t)wVar1);
      wr_item(gear);
      gear = gear->next;
    } while (gear != (object *)0x0);
  }
  wr_byte(0xff);
  return;
}

Assistant:

static void wr_gear_aux(struct object *gear)
{
	struct object *obj;

	/* Write the inventory */
	for (obj = gear; obj; obj = obj->next) {
		/* Skip non-objects */
		assert(obj->kind);

		/* Write code for equipment or other gear */
		wr_byte(object_slot(player->body, obj));

		/* Dump object */
		wr_item(obj);

	}

	/* Write finished code */
	wr_byte(FINISHED_CODE);
}